

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalNinjaGenerator::AppendTargetDepends
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,cmNinjaDeps *outputs,
          cmNinjaTargetDepends depends)

{
  pointer pcVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  TargetType TVar5;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *psVar6;
  cmLocalGenerator *this_00;
  string *psVar7;
  long *plVar8;
  _Base_ptr p_Var9;
  TargetDependSet *pTVar10;
  ulong uVar11;
  _Rb_tree_header *p_Var12;
  pointer pbVar13;
  string d;
  undefined1 local_78 [32];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)outputs;
  TVar5 = cmGeneratorTarget::GetType(target);
  if (TVar5 == GLOBAL_TARGET) {
    psVar6 = cmGeneratorTarget::GetUtilities_abi_cxx11_(target);
    p_Var9 = (psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = &(psVar6->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var12) {
      do {
        this_00 = cmGeneratorTarget::GetLocalGenerator(target);
        psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
        local_50[0] = local_40;
        pcVar1 = (psVar7->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar1,pcVar1 + psVar7->_M_string_length);
        std::__cxx11::string::append((char *)local_50);
        plVar8 = (long *)std::__cxx11::string::_M_append((char *)local_50,*(ulong *)(p_Var9 + 1));
        pbVar13 = (pointer)(plVar8 + 2);
        if ((pointer)*plVar8 == pbVar13) {
          local_78._16_8_ = (pbVar13->_M_dataplus)._M_p;
          local_78._24_8_ = plVar8[3];
          local_78._0_8_ = (pointer)(local_78 + 0x10);
        }
        else {
          local_78._16_8_ = (pbVar13->_M_dataplus)._M_p;
          local_78._0_8_ = (pointer)*plVar8;
        }
        local_78._8_8_ = plVar8[1];
        *plVar8 = (long)pbVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        psVar7 = ConvertToNinjaPath(this,(string *)local_78);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_58,psVar7);
        if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var12);
    }
  }
  else {
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = (pointer)0x0;
    local_78._16_8_ = (pointer)0x0;
    pTVar10 = cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,target);
    p_Var9 = (pTVar10->
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
             _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = &(pTVar10->
               super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
               )._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 == p_Var12) {
      pbVar13 = (pointer)0x0;
    }
    else {
      do {
        TVar5 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var9 + 1));
        if (TVar5 != INTERFACE_LIBRARY) {
          AppendTargetOutputs(this,*(cmGeneratorTarget **)(p_Var9 + 1),(cmNinjaDeps *)local_78,
                              depends);
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        uVar4 = local_78._8_8_;
        uVar3 = local_78._0_8_;
      } while ((_Rb_tree_header *)p_Var9 != p_Var12);
      pbVar13 = (pointer)local_78._0_8_;
      if (local_78._0_8_ != local_78._8_8_) {
        uVar11 = (long)(local_78._8_8_ - local_78._0_8_) >> 5;
        lVar2 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_78._0_8_,local_78._8_8_,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (uVar3,uVar4);
        pbVar13 = (pointer)local_78._0_8_;
      }
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (local_58,*(undefined8 *)(local_58 + 8),pbVar13,local_78._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_78);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetDepends(
  cmGeneratorTarget const* target, cmNinjaDeps& outputs,
  cmNinjaTargetDepends depends)
{
  if (target->GetType() == cmStateEnums::GLOBAL_TARGET) {
    // These depend only on other CMake-provided targets, e.g. "all".
    for (BT<std::string> const& util : target->GetUtilities()) {
      std::string d =
        target->GetLocalGenerator()->GetCurrentBinaryDirectory() + "/" +
        util.Value;
      outputs.push_back(this->ConvertToNinjaPath(d));
    }
  } else {
    cmNinjaDeps outs;
    for (cmTargetDepend const& targetDep :
         this->GetTargetDirectDepends(target)) {
      if (targetDep->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }
      this->AppendTargetOutputs(targetDep, outs, depends);
    }
    std::sort(outs.begin(), outs.end());
    cmAppend(outputs, outs);
  }
}